

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

bool __thiscall wabt::SharedValidator::ValidInitOpcode(SharedValidator *this,Opcode opcode)

{
  byte bVar1;
  
  bVar1 = 1;
  if ((((F64Const < opcode.enum_) ||
       ((0x1e00000040000000U >> ((ulong)opcode.enum_ & 0x3f) & 1) == 0)) &&
      (opcode.enum_ != RefNull)) && (opcode.enum_ != RefFunc)) {
    if (((this->options_).features.extended_const_enabled_ == true) &&
       (opcode.enum_ - I32Add < 0x15)) {
      bVar1 = (byte)(0x1c0007 >> ((byte)(opcode.enum_ - I32Add) & 0x1f));
    }
    else {
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool SharedValidator::ValidInitOpcode(Opcode opcode) const {
  if (opcode == Opcode::GlobalGet || opcode == Opcode::I32Const ||
      opcode == Opcode::I64Const || opcode == Opcode::F32Const ||
      opcode == Opcode::F64Const || opcode == Opcode::RefFunc ||
      opcode == Opcode::RefNull) {
    return true;
  }
  if (options_.features.extended_const_enabled()) {
    if (opcode == Opcode::I32Mul || opcode == Opcode::I64Mul ||
        opcode == Opcode::I32Sub || opcode == Opcode::I64Sub ||
        opcode == Opcode::I32Add || opcode == Opcode::I64Add) {
      return true;
    }
  }
  return false;
}